

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void mafilter2(double *sig,int N,int window,double *oup)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  iVar5 = (int)((long)window / 2);
  if (iVar5 * 2 == window) {
    uVar3 = 0;
    uVar7 = 0;
    if (0 < iVar5) {
      uVar7 = (long)window / 2 & 0xffffffff;
    }
    for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      oup[uVar3] = sig[uVar3];
    }
    lVar4 = (long)iVar5;
    lVar2 = (long)(N - iVar5);
    lVar6 = lVar4 * 2;
    lVar8 = 0;
    for (lVar9 = lVar4; lVar9 < lVar2; lVar9 = lVar9 + 1) {
      dVar11 = 0.0;
      for (lVar10 = (long)(int)lVar8; lVar10 <= lVar9 + lVar4; lVar10 = lVar10 + 1) {
        dVar13 = sig[lVar10] * 0.5 + dVar11;
        dVar12 = dVar13;
        if (lVar6 != lVar10) {
          dVar12 = dVar11 + sig[lVar10];
        }
        dVar11 = dVar13;
        if (lVar8 != lVar10) {
          dVar11 = dVar12;
        }
      }
      oup[lVar9] = dVar11 / (double)window;
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 1;
    }
    for (; lVar2 < N; lVar2 = lVar2 + 1) {
      oup[lVar2] = sig[lVar2];
    }
  }
  else {
    uVar1 = (window + -1) / 2;
    uVar3 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      oup[uVar3] = sig[uVar3];
    }
    lVar9 = (long)(int)(N - uVar1);
    iVar5 = 0;
    for (lVar6 = (long)(int)uVar1; lVar6 < lVar9; lVar6 = lVar6 + 1) {
      dVar11 = 0.0;
      for (lVar2 = (long)iVar5; lVar2 <= lVar6 + (int)uVar1; lVar2 = lVar2 + 1) {
        dVar11 = dVar11 + sig[lVar2];
      }
      oup[lVar6] = dVar11 / (double)window;
      iVar5 = iVar5 + 1;
    }
    for (; lVar9 < N; lVar9 = lVar9 + 1) {
      oup[lVar9] = sig[lVar9];
    }
  }
  return;
}

Assistant:

void mafilter2(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	/*
	 * mafilter2 is a smoothing filter that smoothes a signal by using
	 * a window. No signal extension is done in this case. Instead,
	 * first floor(window/2) signal terms and last [window - floor(window/2)]
	 * terms are left untouched. The smoothing is performed over the rest
	 * of the terms.
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	if (odd) {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += sig[j];
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	} else {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * sig[j];
				} else {
					sum += sig[j];
				}
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	}
}